

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

Layer * ncnn::create_layer_naive(char *type)

{
  int iVar1;
  int index;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined8 in_stack_fffffffffffffff8;
  int index_00;
  Layer *pLVar2;
  
  index_00 = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  iVar1 = layer_to_index((char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (iVar1 == -1) {
    pLVar2 = (Layer *)0x0;
  }
  else {
    pLVar2 = create_layer_naive(index_00);
  }
  return pLVar2;
}

Assistant:

Layer* create_layer_naive(const char* type)
{
    int index = layer_to_index(type);
    if (index == -1)
        return 0;

    return create_layer_naive(index);
}